

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O1

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddRawTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
          *pegins,vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *txouts,
          vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          *pegouts,ConfidentialTxOut *txout_fee,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *pegout_addresses)

{
  pointer pCVar1;
  pointer pTVar2;
  pointer pCVar3;
  void *pvVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ConfidentialTxInReference *this_00;
  pointer this_01;
  ByteData *tx_out_proof;
  pointer pTVar9;
  pointer this_02;
  pointer value;
  Amount AVar10;
  undefined1 local_a48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a38;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *local_a20;
  pointer local_a18;
  undefined1 local_a10 [16];
  pointer local_a00;
  ConfidentialNonce local_9f8;
  Address pegout_address;
  Address dummy_addr;
  ConfidentialTxOutReference local_6d0;
  ConfidentialTxOutReference local_5d8;
  ConfidentialTxInReference local_4e0;
  ConfidentialTxOutReference local_380;
  ConfidentialTxOutReference local_288;
  ConfidentialTxInReference local_190;
  
  local_a20 = txouts;
  local_a18 = (pointer)pegins;
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  uVar6 = AbstractTransactionController::GetLockTimeDisabledSequence();
  this_01 = (txins->
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (txins->
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pCVar1) {
    do {
      uVar7 = core::AbstractTxIn::GetSequence(&this_01->super_AbstractTxIn);
      if (uVar6 == uVar7) {
        core::AbstractTxIn::GetTxid((Txid *)&pegout_address,&this_01->super_AbstractTxIn);
        uVar7 = core::AbstractTxIn::GetVout(&this_01->super_AbstractTxIn);
        uVar8 = AbstractTransactionController::GetDefaultSequence
                          (&__return_storage_ptr__->super_AbstractTransactionController);
        ConfidentialTransactionController::AddTxIn
                  (&local_4e0,__return_storage_ptr__,(Txid *)&pegout_address,uVar7,uVar8);
        this_00 = &local_4e0;
      }
      else {
        core::AbstractTxIn::GetTxid((Txid *)&pegout_address,&this_01->super_AbstractTxIn);
        uVar7 = core::AbstractTxIn::GetVout(&this_01->super_AbstractTxIn);
        uVar8 = core::AbstractTxIn::GetSequence(&this_01->super_AbstractTxIn);
        ConfidentialTransactionController::AddTxIn
                  (&local_190,__return_storage_ptr__,(Txid *)&pegout_address,uVar7,uVar8);
        this_00 = &local_190;
      }
      core::ConfidentialTxInReference::~ConfidentialTxInReference(this_00);
      pegout_address._0_8_ = &PTR__Txid_0087c9b8;
      if (pegout_address._8_8_ != 0) {
        operator_delete((void *)pegout_address._8_8_,
                        pegout_address.address_._M_string_length - pegout_address._8_8_);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pCVar1);
  }
  pTVar9 = (((_Vector_base<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
              *)&local_a18->amount)->_M_impl).super__Vector_impl_data._M_start;
  pTVar2 = (((_Vector_base<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
              *)&local_a18->amount)->_M_impl).super__Vector_impl_data._M_finish;
  if (pTVar9 != pTVar2) {
    tx_out_proof = &pTVar9->mainchain_txoutproof;
    do {
      ConfidentialTransactionController::AddPeginWitness
                (__return_storage_ptr__,(Txid *)((long)(tx_out_proof + -9) + 8),
                 *(uint32_t *)((long)(tx_out_proof + -8) + 0x10),(Amount *)(tx_out_proof + -7),
                 (ConfidentialAssetId *)((Amount *)(tx_out_proof + -7) + 1),
                 (BlockHash *)((long)(tx_out_proof + -5) + 8),
                 (Script *)((long)(tx_out_proof + -4) + 0x10),tx_out_proof + -1,tx_out_proof);
      pTVar9 = (pointer)(tx_out_proof + 1);
      tx_out_proof = (ByteData *)((long)(tx_out_proof + 9) + 0x10);
    } while (pTVar9 != pTVar2);
  }
  this_02 = (local_a20->
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (local_a20->
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this_02 != pCVar3) {
    do {
      core::AbstractTxOut::GetLockingScript((Script *)&pegout_address,&this_02->super_AbstractTxOut)
      ;
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&dummy_addr,&this_02->confidential_value_);
      AVar10 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&dummy_addr);
      local_a10._0_8_ = AVar10.amount_;
      local_a10[8] = AVar10.ignore_check_;
      core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_a48,&this_02->asset_);
      core::ConfidentialNonce::ConfidentialNonce(&local_9f8,&this_02->nonce_);
      ConfidentialTransactionController::AddTxOut
                (&local_288,__return_storage_ptr__,(Script *)&pegout_address,(Amount *)local_a10,
                 (ConfidentialAssetId *)local_a48,&local_9f8);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_288);
      local_9f8._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0087cc78;
      if (local_9f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_9f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_9f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_9f8.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_a48._0_8_ = &PTR__ConfidentialAssetId_0087ccc8;
      pvVar4 = (void *)CONCAT71(local_a48._9_7_,local_a48[8]);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,local_a38._8_8_ - (long)pvVar4);
      }
      dummy_addr._0_8_ = &PTR__ConfidentialValue_0087cda8;
      pvVar4 = (void *)CONCAT71(dummy_addr._9_7_,(undefined1)dummy_addr.witness_ver_);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,dummy_addr.address_._M_string_length - (long)pvVar4);
      }
      core::Script::~Script((Script *)&pegout_address);
      this_02 = this_02 + 1;
    } while (this_02 != pCVar3);
  }
  value = (pegouts->
          super__Vector_base<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_a18 = (pegouts->
              super__Vector_base<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (value != local_a18) {
    do {
      core::Address::Address(&pegout_address);
      bVar5 = core::Pubkey::IsValid(&value->online_pubkey);
      if (bVar5) {
        bVar5 = core::Privkey::IsInvalid((Privkey *)&value->master_online_key);
        if (bVar5) goto LAB_004018e0;
        core::Address::Address(&dummy_addr);
        local_a20 = (vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     *)(ulong)(uint)value->net_type;
        ConfidentialTransactionController::AddPegoutTxOut
                  (&local_5d8,__return_storage_ptr__,&value->amount,&value->asset,
                   &value->genesisblock_hash,&dummy_addr,value->net_type,&value->online_pubkey,
                   (Privkey *)&value->master_online_key,&value->bitcoin_descriptor,
                   value->bip32_counter,&value->whitelist,value->elements_net_type,&pegout_address);
        core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_5d8);
        core::Address::~Address(&dummy_addr);
      }
      else {
LAB_004018e0:
        core::Pubkey::Pubkey((Pubkey *)&local_9f8);
        core::Privkey::Privkey((Privkey *)&dummy_addr);
        local_a48._0_8_ = &local_a38;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"");
        core::ByteData::ByteData((ByteData *)local_a10);
        ConfidentialTransactionController::AddPegoutTxOut
                  (&local_380,__return_storage_ptr__,&value->amount,&value->asset,
                   &value->genesisblock_hash,&value->btc_address,kMainnet,(Pubkey *)&local_9f8,
                   (Privkey *)&dummy_addr,(string *)local_a48,0,(ByteData *)local_a10,kLiquidV1,
                   (Address *)0x0);
        core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_380);
        if ((pointer)local_a10._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_a10._0_8_,(long)local_a00 - local_a10._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a48._0_8_ != &local_a38) {
          operator_delete((void *)local_a48._0_8_,(ulong)(local_a38._M_allocated_capacity + 1));
        }
        if (dummy_addr._0_8_ != 0) {
          operator_delete((void *)dummy_addr._0_8_,
                          (long)dummy_addr.address_._M_dataplus._M_p - dummy_addr._0_8_);
        }
        if (local_9f8._vptr_ConfidentialNonce != (_func_int **)0x0) {
          operator_delete(local_9f8._vptr_ConfidentialNonce,
                          (long)local_9f8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_9f8._vptr_ConfidentialNonce);
        }
      }
      if (pegout_addresses !=
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
           *)0x0) {
        core::Address::GetAddress_abi_cxx11_((string *)&dummy_addr,&pegout_address);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
        ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
                    *)pegout_addresses,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy_addr,
                   &value->amount);
        if ((string *)dummy_addr._0_8_ != &dummy_addr.address_) {
          operator_delete((void *)dummy_addr._0_8_,(ulong)(dummy_addr.address_._M_dataplus._M_p + 1)
                         );
        }
      }
      core::Address::~Address(&pegout_address);
      value = value + 1;
    } while (value != local_a18);
  }
  core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&pegout_address,&txout_fee->confidential_value_);
  AVar10 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&pegout_address);
  dummy_addr._0_8_ = AVar10.amount_;
  dummy_addr.witness_ver_._0_1_ = AVar10.ignore_check_;
  bVar5 = core::Amount::operator!=((Amount *)&dummy_addr,0);
  pegout_address._0_8_ = &PTR__ConfidentialValue_0087cda8;
  if (pegout_address._8_8_ != 0) {
    operator_delete((void *)pegout_address._8_8_,
                    pegout_address.address_._M_string_length - pegout_address._8_8_);
  }
  if (bVar5) {
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&pegout_address,&txout_fee->confidential_value_);
    AVar10 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&pegout_address);
    local_a48._0_8_ = AVar10.amount_;
    local_a48[8] = AVar10.ignore_check_;
    core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)&dummy_addr,&txout_fee->asset_);
    ConfidentialTransactionController::AddTxOutFee
              (&local_6d0,__return_storage_ptr__,(Amount *)local_a48,
               (ConfidentialAssetId *)&dummy_addr);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_6d0);
    dummy_addr._0_8_ = &PTR__ConfidentialAssetId_0087ccc8;
    pvVar4 = (void *)CONCAT71(dummy_addr._9_7_,(undefined1)dummy_addr.witness_ver_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,dummy_addr.address_._M_string_length - (long)pvVar4);
    }
    pegout_address._0_8_ = &PTR__ConfidentialValue_0087cda8;
    if (pegout_address._8_8_ != 0) {
      operator_delete((void *)pegout_address._8_8_,
                      pegout_address.address_._M_string_length - pegout_address._8_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddRawTransaction(
    const std::string& tx_hex, const std::vector<ConfidentialTxIn>& txins,
    const std::vector<TxInPeginParameters>& pegins,
    const std::vector<ConfidentialTxOut>& txouts,
    const std::vector<TxOutPegoutParameters>& pegouts,
    const ConfidentialTxOut& txout_fee,
    std::map<std::string, Amount>* pegout_addresses) const {
  ConfidentialTransactionController ctxc(tx_hex);

  const uint32_t kLockTimeDisabledSequence =
      ctxc.GetLockTimeDisabledSequence();
  for (const auto& txin : txins) {
    // Create TxIn's unlocking_script as empty.
    if (kLockTimeDisabledSequence == txin.GetSequence()) {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), ctxc.GetDefaultSequence());
    } else {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
    }
  }

  for (const auto& pegin_data : pegins) {
    ctxc.AddPeginWitness(
        pegin_data.txid, pegin_data.vout, pegin_data.amount, pegin_data.asset,
        pegin_data.mainchain_blockhash, pegin_data.claim_script,
        pegin_data.mainchain_raw_tx, pegin_data.mainchain_txoutproof);
  }

  for (const auto& txout : txouts) {
    ctxc.AddTxOut(
        txout.GetLockingScript(), txout.GetConfidentialValue().GetAmount(),
        txout.GetAsset(), txout.GetNonce());
  }

  for (const auto& pegout_data : pegouts) {
    Address pegout_address;
    if (pegout_data.online_pubkey.IsValid() &&
        !pegout_data.master_online_key.IsInvalid()) {
      Address dummy_addr;
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
          pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
          pegout_data.bip32_counter, pegout_data.whitelist,
          pegout_data.elements_net_type, &pegout_address);
    } else {
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          pegout_data.btc_address);
    }
    if (pegout_addresses != nullptr) {
      pegout_addresses->emplace(
          pegout_address.GetAddress(), pegout_data.amount);
    }
  }

  // A fee with an amount of 0 is considered invalid.
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}